

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O0

Am_Text_Style_Run * __thiscall
Am_Rich_Text_Data::Get_Style_Run_At(Am_Rich_Text_Data *this,Am_Text_Index inIndex)

{
  unsigned_long uVar1;
  Am_Text_Style_Run *local_28;
  Am_Text_Style_Run *sr;
  Am_Text_Index endOfRun;
  Am_Text_Index inIndex_local;
  Am_Rich_Text_Data *this_local;
  
  sr = (Am_Text_Style_Run *)0x0;
  local_28 = this->mHeadStyle;
  while( true ) {
    if (local_28 == (Am_Text_Style_Run *)0x0) {
      return (Am_Text_Style_Run *)0x0;
    }
    uVar1 = Am_Text_Style_Run::Length(local_28);
    sr = (Am_Text_Style_Run *)((long)&sr->mCharsInRun + uVar1);
    if (inIndex <= sr) break;
    local_28 = Am_Text_Style_Run::Next(local_28);
  }
  return local_28;
}

Assistant:

Am_Text_Style_Run *
Am_Rich_Text_Data::Get_Style_Run_At(const Am_Text_Index inIndex) const
{
  Am_Text_Index endOfRun = 0;
  Am_Text_Style_Run *sr = mHeadStyle;

  while (sr != nullptr) {
    endOfRun += sr->Length();
    if (inIndex <= endOfRun)
      break;
    sr = sr->Next();
  }
  return sr;
}